

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double * multinomial_covariance(int a,int b,double *c)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  int local_28;
  int local_24;
  int j;
  int i;
  double *covariance;
  double *c_local;
  int b_local;
  int a_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(b * b);
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  for (local_24 = 0; local_24 < b; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < b; local_28 = local_28 + 1) {
      if (local_24 == local_28) {
        pdVar3[local_24 + local_28 * b] = (double)a * c[local_24] * (1.0 - c[local_24]);
      }
      else {
        pdVar3[local_24 + local_28 * b] = -(double)a * c[local_24] * c[local_28];
      }
    }
  }
  return pdVar3;
}

Assistant:

double *multinomial_covariance ( int a, int b, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    MULTINOMIAL_COVARIANCE returns the covariances of the Multinomial PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 February 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of trials.
//
//    Input, int B, the number of outcomes possible on one trial.
//    1 <= B.
//
//    Input, double C(B).  C(I) is the probability of outcome I on
//    any trial.
//    0.0 <= C(I) <= 1.0,
//    SUM ( 1 <= I <= B) C(I) = 1.0.
//
//    Output, double MULTINOMIAL_COVARIANCE[B*B], the covariance matrix.
//
{
  double *covariance;
  int i;
  int j;

  covariance = new double[b*b];

  for ( i = 0; i < b; i++)
  {
    for ( j = 0; j < b; j++ )
    {
      if ( i == j )
      {
        covariance[i+j*b] = static_cast<double>(a ) * c[i] * ( 1.0 - c[i] );
      }
      else
      {
        covariance[i+j*b] = - static_cast<double>(a ) * c[i] * c[j];
      }
    }
  }

  return covariance;
}